

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_block.c
# Opt level: O0

void beltBlockDecr(octet *block,u32 *key)

{
  u32 *t;
  u32 *key_local;
  octet *block_local;
  
  *(u32 *)(block + 4) =
       H5[*(int *)block + key[7] & 0xff] ^ H13[*(int *)block + key[7] >> 8 & 0xff] ^
       H21[*(int *)block + key[7] >> 0x10 & 0xff] ^ H29[*(int *)block + key[7] >> 0x18] ^
       *(uint *)(block + 4);
  *(u32 *)(block + 8) =
       H21[*(int *)(block + 0xc) + key[6] & 0xff] ^ H29[*(int *)(block + 0xc) + key[6] >> 8 & 0xff]
       ^ H5[*(int *)(block + 0xc) + key[6] >> 0x10 & 0xff] ^
       H13[*(int *)(block + 0xc) + key[6] >> 0x18] ^ *(uint *)(block + 8);
  *(u32 *)block =
       *(int *)block -
       (H13[*(int *)(block + 4) + key[5] & 0xff] ^ H21[*(int *)(block + 4) + key[5] >> 8 & 0xff] ^
        H29[*(int *)(block + 4) + key[5] >> 0x10 & 0xff] ^ H5[*(int *)(block + 4) + key[5] >> 0x18])
  ;
  *(int *)(block + 8) = *(int *)(block + 4) + *(int *)(block + 8);
  *(u32 *)(block + 4) =
       (H21[*(int *)(block + 8) + key[4] & 0xff] ^ H29[*(int *)(block + 8) + key[4] >> 8 & 0xff] ^
        H5[*(int *)(block + 8) + key[4] >> 0x10 & 0xff] ^ H13[*(int *)(block + 8) + key[4] >> 0x18]
       ^ 8) + *(int *)(block + 4);
  *(int *)(block + 8) = *(int *)(block + 8) - *(int *)(block + 4);
  *(u32 *)(block + 0xc) =
       (H13[*(int *)(block + 8) + key[3] & 0xff] ^ H21[*(int *)(block + 8) + key[3] >> 8 & 0xff] ^
        H29[*(int *)(block + 8) + key[3] >> 0x10 & 0xff] ^ H5[*(int *)(block + 8) + key[3] >> 0x18])
       + *(int *)(block + 0xc);
  *(u32 *)(block + 4) =
       H21[*(int *)block + key[2] & 0xff] ^ H29[*(int *)block + key[2] >> 8 & 0xff] ^
       H5[*(int *)block + key[2] >> 0x10 & 0xff] ^ H13[*(int *)block + key[2] >> 0x18] ^
       *(uint *)(block + 4);
  *(u32 *)(block + 8) =
       H5[*(int *)(block + 0xc) + key[1] & 0xff] ^ H13[*(int *)(block + 0xc) + key[1] >> 8 & 0xff] ^
       H21[*(int *)(block + 0xc) + key[1] >> 0x10 & 0xff] ^
       H29[*(int *)(block + 0xc) + key[1] >> 0x18] ^ *(uint *)(block + 8);
  *(u32 *)block =
       H5[*(int *)(block + 8) + *key & 0xff] ^ H13[*(int *)(block + 8) + *key >> 8 & 0xff] ^
       H21[*(int *)(block + 8) + *key >> 0x10 & 0xff] ^ H29[*(int *)(block + 8) + *key >> 0x18] ^
       *(uint *)block;
  *(u32 *)(block + 0xc) =
       H21[*(int *)(block + 4) + key[7] & 0xff] ^ H29[*(int *)(block + 4) + key[7] >> 8 & 0xff] ^
       H5[*(int *)(block + 4) + key[7] >> 0x10 & 0xff] ^ H13[*(int *)(block + 4) + key[7] >> 0x18] ^
       *(uint *)(block + 0xc);
  *(u32 *)(block + 8) =
       *(int *)(block + 8) -
       (H13[*(int *)block + key[6] & 0xff] ^ H21[*(int *)block + key[6] >> 8 & 0xff] ^
        H29[*(int *)block + key[6] >> 0x10 & 0xff] ^ H5[*(int *)block + key[6] >> 0x18]);
  *(int *)(block + 0xc) = *(int *)block + *(int *)(block + 0xc);
  *(u32 *)block =
       (H21[*(int *)(block + 0xc) + key[5] & 0xff] ^ H29[*(int *)(block + 0xc) + key[5] >> 8 & 0xff]
        ^ H5[*(int *)(block + 0xc) + key[5] >> 0x10 & 0xff] ^
        H13[*(int *)(block + 0xc) + key[5] >> 0x18] ^ 7) + *(int *)block;
  *(int *)(block + 0xc) = *(int *)(block + 0xc) - *(int *)block;
  *(u32 *)(block + 4) =
       (H13[*(int *)(block + 0xc) + key[4] & 0xff] ^ H21[*(int *)(block + 0xc) + key[4] >> 8 & 0xff]
        ^ H29[*(int *)(block + 0xc) + key[4] >> 0x10 & 0xff] ^
       H5[*(int *)(block + 0xc) + key[4] >> 0x18]) + *(int *)(block + 4);
  *(u32 *)block =
       H21[*(int *)(block + 8) + key[3] & 0xff] ^ H29[*(int *)(block + 8) + key[3] >> 8 & 0xff] ^
       H5[*(int *)(block + 8) + key[3] >> 0x10 & 0xff] ^ H13[*(int *)(block + 8) + key[3] >> 0x18] ^
       *(uint *)block;
  *(u32 *)(block + 0xc) =
       H5[*(int *)(block + 4) + key[2] & 0xff] ^ H13[*(int *)(block + 4) + key[2] >> 8 & 0xff] ^
       H21[*(int *)(block + 4) + key[2] >> 0x10 & 0xff] ^ H29[*(int *)(block + 4) + key[2] >> 0x18]
       ^ *(uint *)(block + 0xc);
  *(u32 *)(block + 8) =
       H5[*(int *)(block + 0xc) + key[1] & 0xff] ^ H13[*(int *)(block + 0xc) + key[1] >> 8 & 0xff] ^
       H21[*(int *)(block + 0xc) + key[1] >> 0x10 & 0xff] ^
       H29[*(int *)(block + 0xc) + key[1] >> 0x18] ^ *(uint *)(block + 8);
  *(u32 *)(block + 4) =
       H21[*(int *)block + *key & 0xff] ^ H29[*(int *)block + *key >> 8 & 0xff] ^
       H5[*(int *)block + *key >> 0x10 & 0xff] ^ H13[*(int *)block + *key >> 0x18] ^
       *(uint *)(block + 4);
  *(u32 *)(block + 0xc) =
       *(int *)(block + 0xc) -
       (H13[*(int *)(block + 8) + key[7] & 0xff] ^ H21[*(int *)(block + 8) + key[7] >> 8 & 0xff] ^
        H29[*(int *)(block + 8) + key[7] >> 0x10 & 0xff] ^ H5[*(int *)(block + 8) + key[7] >> 0x18])
  ;
  *(int *)(block + 4) = *(int *)(block + 8) + *(int *)(block + 4);
  *(u32 *)(block + 8) =
       (H21[*(int *)(block + 4) + key[6] & 0xff] ^ H29[*(int *)(block + 4) + key[6] >> 8 & 0xff] ^
        H5[*(int *)(block + 4) + key[6] >> 0x10 & 0xff] ^ H13[*(int *)(block + 4) + key[6] >> 0x18]
       ^ 6) + *(int *)(block + 8);
  *(int *)(block + 4) = *(int *)(block + 4) - *(int *)(block + 8);
  *(u32 *)block =
       (H13[*(int *)(block + 4) + key[5] & 0xff] ^ H21[*(int *)(block + 4) + key[5] >> 8 & 0xff] ^
        H29[*(int *)(block + 4) + key[5] >> 0x10 & 0xff] ^ H5[*(int *)(block + 4) + key[5] >> 0x18])
       + *(int *)block;
  *(u32 *)(block + 8) =
       H21[*(int *)(block + 0xc) + key[4] & 0xff] ^ H29[*(int *)(block + 0xc) + key[4] >> 8 & 0xff]
       ^ H5[*(int *)(block + 0xc) + key[4] >> 0x10 & 0xff] ^
       H13[*(int *)(block + 0xc) + key[4] >> 0x18] ^ *(uint *)(block + 8);
  *(u32 *)(block + 4) =
       H5[*(int *)block + key[3] & 0xff] ^ H13[*(int *)block + key[3] >> 8 & 0xff] ^
       H21[*(int *)block + key[3] >> 0x10 & 0xff] ^ H29[*(int *)block + key[3] >> 0x18] ^
       *(uint *)(block + 4);
  *(u32 *)(block + 0xc) =
       H5[*(int *)(block + 4) + key[2] & 0xff] ^ H13[*(int *)(block + 4) + key[2] >> 8 & 0xff] ^
       H21[*(int *)(block + 4) + key[2] >> 0x10 & 0xff] ^ H29[*(int *)(block + 4) + key[2] >> 0x18]
       ^ *(uint *)(block + 0xc);
  *(u32 *)block =
       H21[*(int *)(block + 8) + key[1] & 0xff] ^ H29[*(int *)(block + 8) + key[1] >> 8 & 0xff] ^
       H5[*(int *)(block + 8) + key[1] >> 0x10 & 0xff] ^ H13[*(int *)(block + 8) + key[1] >> 0x18] ^
       *(uint *)block;
  *(u32 *)(block + 4) =
       *(int *)(block + 4) -
       (H13[*(int *)(block + 0xc) + *key & 0xff] ^ H21[*(int *)(block + 0xc) + *key >> 8 & 0xff] ^
        H29[*(int *)(block + 0xc) + *key >> 0x10 & 0xff] ^ H5[*(int *)(block + 0xc) + *key >> 0x18])
  ;
  *(int *)block = *(int *)(block + 0xc) + *(int *)block;
  *(u32 *)(block + 0xc) =
       (H21[*(int *)block + key[7] & 0xff] ^ H29[*(int *)block + key[7] >> 8 & 0xff] ^
        H5[*(int *)block + key[7] >> 0x10 & 0xff] ^ H13[*(int *)block + key[7] >> 0x18] ^ 5) +
       *(int *)(block + 0xc);
  *(int *)block = *(int *)block - *(int *)(block + 0xc);
  *(u32 *)(block + 8) =
       (H13[*(int *)block + key[6] & 0xff] ^ H21[*(int *)block + key[6] >> 8 & 0xff] ^
        H29[*(int *)block + key[6] >> 0x10 & 0xff] ^ H5[*(int *)block + key[6] >> 0x18]) +
       *(int *)(block + 8);
  *(u32 *)(block + 0xc) =
       H21[*(int *)(block + 4) + key[5] & 0xff] ^ H29[*(int *)(block + 4) + key[5] >> 8 & 0xff] ^
       H5[*(int *)(block + 4) + key[5] >> 0x10 & 0xff] ^ H13[*(int *)(block + 4) + key[5] >> 0x18] ^
       *(uint *)(block + 0xc);
  *(u32 *)block =
       H5[*(int *)(block + 8) + key[4] & 0xff] ^ H13[*(int *)(block + 8) + key[4] >> 8 & 0xff] ^
       H21[*(int *)(block + 8) + key[4] >> 0x10 & 0xff] ^ H29[*(int *)(block + 8) + key[4] >> 0x18]
       ^ *(uint *)block;
  *(u32 *)(block + 4) =
       H5[*(int *)block + key[3] & 0xff] ^ H13[*(int *)block + key[3] >> 8 & 0xff] ^
       H21[*(int *)block + key[3] >> 0x10 & 0xff] ^ H29[*(int *)block + key[3] >> 0x18] ^
       *(uint *)(block + 4);
  *(u32 *)(block + 8) =
       H21[*(int *)(block + 0xc) + key[2] & 0xff] ^ H29[*(int *)(block + 0xc) + key[2] >> 8 & 0xff]
       ^ H5[*(int *)(block + 0xc) + key[2] >> 0x10 & 0xff] ^
       H13[*(int *)(block + 0xc) + key[2] >> 0x18] ^ *(uint *)(block + 8);
  *(u32 *)block =
       *(int *)block -
       (H13[*(int *)(block + 4) + key[1] & 0xff] ^ H21[*(int *)(block + 4) + key[1] >> 8 & 0xff] ^
        H29[*(int *)(block + 4) + key[1] >> 0x10 & 0xff] ^ H5[*(int *)(block + 4) + key[1] >> 0x18])
  ;
  *(int *)(block + 8) = *(int *)(block + 4) + *(int *)(block + 8);
  *(u32 *)(block + 4) =
       (H21[*(int *)(block + 8) + *key & 0xff] ^ H29[*(int *)(block + 8) + *key >> 8 & 0xff] ^
        H5[*(int *)(block + 8) + *key >> 0x10 & 0xff] ^ H13[*(int *)(block + 8) + *key >> 0x18] ^ 4)
       + *(int *)(block + 4);
  *(int *)(block + 8) = *(int *)(block + 8) - *(int *)(block + 4);
  *(u32 *)(block + 0xc) =
       (H13[*(int *)(block + 8) + key[7] & 0xff] ^ H21[*(int *)(block + 8) + key[7] >> 8 & 0xff] ^
        H29[*(int *)(block + 8) + key[7] >> 0x10 & 0xff] ^ H5[*(int *)(block + 8) + key[7] >> 0x18])
       + *(int *)(block + 0xc);
  *(u32 *)(block + 4) =
       H21[*(int *)block + key[6] & 0xff] ^ H29[*(int *)block + key[6] >> 8 & 0xff] ^
       H5[*(int *)block + key[6] >> 0x10 & 0xff] ^ H13[*(int *)block + key[6] >> 0x18] ^
       *(uint *)(block + 4);
  *(u32 *)(block + 8) =
       H5[*(int *)(block + 0xc) + key[5] & 0xff] ^ H13[*(int *)(block + 0xc) + key[5] >> 8 & 0xff] ^
       H21[*(int *)(block + 0xc) + key[5] >> 0x10 & 0xff] ^
       H29[*(int *)(block + 0xc) + key[5] >> 0x18] ^ *(uint *)(block + 8);
  *(u32 *)block =
       H5[*(int *)(block + 8) + key[4] & 0xff] ^ H13[*(int *)(block + 8) + key[4] >> 8 & 0xff] ^
       H21[*(int *)(block + 8) + key[4] >> 0x10 & 0xff] ^ H29[*(int *)(block + 8) + key[4] >> 0x18]
       ^ *(uint *)block;
  *(u32 *)(block + 0xc) =
       H21[*(int *)(block + 4) + key[3] & 0xff] ^ H29[*(int *)(block + 4) + key[3] >> 8 & 0xff] ^
       H5[*(int *)(block + 4) + key[3] >> 0x10 & 0xff] ^ H13[*(int *)(block + 4) + key[3] >> 0x18] ^
       *(uint *)(block + 0xc);
  *(u32 *)(block + 8) =
       *(int *)(block + 8) -
       (H13[*(int *)block + key[2] & 0xff] ^ H21[*(int *)block + key[2] >> 8 & 0xff] ^
        H29[*(int *)block + key[2] >> 0x10 & 0xff] ^ H5[*(int *)block + key[2] >> 0x18]);
  *(int *)(block + 0xc) = *(int *)block + *(int *)(block + 0xc);
  *(u32 *)block =
       (H21[*(int *)(block + 0xc) + key[1] & 0xff] ^ H29[*(int *)(block + 0xc) + key[1] >> 8 & 0xff]
        ^ H5[*(int *)(block + 0xc) + key[1] >> 0x10 & 0xff] ^
        H13[*(int *)(block + 0xc) + key[1] >> 0x18] ^ 3) + *(int *)block;
  *(int *)(block + 0xc) = *(int *)(block + 0xc) - *(int *)block;
  *(u32 *)(block + 4) =
       (H13[*(int *)(block + 0xc) + *key & 0xff] ^ H21[*(int *)(block + 0xc) + *key >> 8 & 0xff] ^
        H29[*(int *)(block + 0xc) + *key >> 0x10 & 0xff] ^ H5[*(int *)(block + 0xc) + *key >> 0x18])
       + *(int *)(block + 4);
  *(u32 *)block =
       H21[*(int *)(block + 8) + key[7] & 0xff] ^ H29[*(int *)(block + 8) + key[7] >> 8 & 0xff] ^
       H5[*(int *)(block + 8) + key[7] >> 0x10 & 0xff] ^ H13[*(int *)(block + 8) + key[7] >> 0x18] ^
       *(uint *)block;
  *(u32 *)(block + 0xc) =
       H5[*(int *)(block + 4) + key[6] & 0xff] ^ H13[*(int *)(block + 4) + key[6] >> 8 & 0xff] ^
       H21[*(int *)(block + 4) + key[6] >> 0x10 & 0xff] ^ H29[*(int *)(block + 4) + key[6] >> 0x18]
       ^ *(uint *)(block + 0xc);
  *(u32 *)(block + 8) =
       H5[*(int *)(block + 0xc) + key[5] & 0xff] ^ H13[*(int *)(block + 0xc) + key[5] >> 8 & 0xff] ^
       H21[*(int *)(block + 0xc) + key[5] >> 0x10 & 0xff] ^
       H29[*(int *)(block + 0xc) + key[5] >> 0x18] ^ *(uint *)(block + 8);
  *(u32 *)(block + 4) =
       H21[*(int *)block + key[4] & 0xff] ^ H29[*(int *)block + key[4] >> 8 & 0xff] ^
       H5[*(int *)block + key[4] >> 0x10 & 0xff] ^ H13[*(int *)block + key[4] >> 0x18] ^
       *(uint *)(block + 4);
  *(u32 *)(block + 0xc) =
       *(int *)(block + 0xc) -
       (H13[*(int *)(block + 8) + key[3] & 0xff] ^ H21[*(int *)(block + 8) + key[3] >> 8 & 0xff] ^
        H29[*(int *)(block + 8) + key[3] >> 0x10 & 0xff] ^ H5[*(int *)(block + 8) + key[3] >> 0x18])
  ;
  *(int *)(block + 4) = *(int *)(block + 8) + *(int *)(block + 4);
  *(u32 *)(block + 8) =
       (H21[*(int *)(block + 4) + key[2] & 0xff] ^ H29[*(int *)(block + 4) + key[2] >> 8 & 0xff] ^
        H5[*(int *)(block + 4) + key[2] >> 0x10 & 0xff] ^ H13[*(int *)(block + 4) + key[2] >> 0x18]
       ^ 2) + *(int *)(block + 8);
  *(int *)(block + 4) = *(int *)(block + 4) - *(int *)(block + 8);
  *(u32 *)block =
       (H13[*(int *)(block + 4) + key[1] & 0xff] ^ H21[*(int *)(block + 4) + key[1] >> 8 & 0xff] ^
        H29[*(int *)(block + 4) + key[1] >> 0x10 & 0xff] ^ H5[*(int *)(block + 4) + key[1] >> 0x18])
       + *(int *)block;
  *(u32 *)(block + 8) =
       H21[*(int *)(block + 0xc) + *key & 0xff] ^ H29[*(int *)(block + 0xc) + *key >> 8 & 0xff] ^
       H5[*(int *)(block + 0xc) + *key >> 0x10 & 0xff] ^ H13[*(int *)(block + 0xc) + *key >> 0x18] ^
       *(uint *)(block + 8);
  *(u32 *)(block + 4) =
       H5[*(int *)block + key[7] & 0xff] ^ H13[*(int *)block + key[7] >> 8 & 0xff] ^
       H21[*(int *)block + key[7] >> 0x10 & 0xff] ^ H29[*(int *)block + key[7] >> 0x18] ^
       *(uint *)(block + 4);
  *(u32 *)(block + 0xc) =
       H5[*(int *)(block + 4) + key[6] & 0xff] ^ H13[*(int *)(block + 4) + key[6] >> 8 & 0xff] ^
       H21[*(int *)(block + 4) + key[6] >> 0x10 & 0xff] ^ H29[*(int *)(block + 4) + key[6] >> 0x18]
       ^ *(uint *)(block + 0xc);
  *(u32 *)block =
       H21[*(int *)(block + 8) + key[5] & 0xff] ^ H29[*(int *)(block + 8) + key[5] >> 8 & 0xff] ^
       H5[*(int *)(block + 8) + key[5] >> 0x10 & 0xff] ^ H13[*(int *)(block + 8) + key[5] >> 0x18] ^
       *(uint *)block;
  *(u32 *)(block + 4) =
       *(int *)(block + 4) -
       (H13[*(int *)(block + 0xc) + key[4] & 0xff] ^ H21[*(int *)(block + 0xc) + key[4] >> 8 & 0xff]
        ^ H29[*(int *)(block + 0xc) + key[4] >> 0x10 & 0xff] ^
       H5[*(int *)(block + 0xc) + key[4] >> 0x18]);
  *(int *)block = *(int *)(block + 0xc) + *(int *)block;
  *(u32 *)(block + 0xc) =
       (H21[*(int *)block + key[3] & 0xff] ^ H29[*(int *)block + key[3] >> 8 & 0xff] ^
        H5[*(int *)block + key[3] >> 0x10 & 0xff] ^ H13[*(int *)block + key[3] >> 0x18] ^ 1) +
       *(int *)(block + 0xc);
  *(int *)block = *(int *)block - *(int *)(block + 0xc);
  *(u32 *)(block + 8) =
       (H13[*(int *)block + key[2] & 0xff] ^ H21[*(int *)block + key[2] >> 8 & 0xff] ^
        H29[*(int *)block + key[2] >> 0x10 & 0xff] ^ H5[*(int *)block + key[2] >> 0x18]) +
       *(int *)(block + 8);
  *(u32 *)(block + 0xc) =
       H21[*(int *)(block + 4) + key[1] & 0xff] ^ H29[*(int *)(block + 4) + key[1] >> 8 & 0xff] ^
       H5[*(int *)(block + 4) + key[1] >> 0x10 & 0xff] ^ H13[*(int *)(block + 4) + key[1] >> 0x18] ^
       *(uint *)(block + 0xc);
  *(u32 *)block =
       H5[*(int *)(block + 8) + *key & 0xff] ^ H13[*(int *)(block + 8) + *key >> 8 & 0xff] ^
       H21[*(int *)(block + 8) + *key >> 0x10 & 0xff] ^ H29[*(int *)(block + 8) + *key >> 0x18] ^
       *(uint *)block;
  *(uint *)block = *(uint *)(block + 4) ^ *(uint *)block;
  *(uint *)(block + 4) = *(uint *)block ^ *(uint *)(block + 4);
  *(uint *)block = *(uint *)(block + 4) ^ *(uint *)block;
  *(uint *)(block + 8) = *(uint *)(block + 0xc) ^ *(uint *)(block + 8);
  *(uint *)(block + 0xc) = *(uint *)(block + 8) ^ *(uint *)(block + 0xc);
  *(uint *)(block + 8) = *(uint *)(block + 0xc) ^ *(uint *)(block + 8);
  *(uint *)block = *(uint *)(block + 0xc) ^ *(uint *)block;
  *(uint *)(block + 0xc) = *(uint *)block ^ *(uint *)(block + 0xc);
  *(uint *)block = *(uint *)(block + 0xc) ^ *(uint *)block;
  return;
}

Assistant:

void beltBlockDecr(octet block[16], const u32 key[8])
{
	u32* t = (u32*)block;
	ASSERT(memIsDisjoint2(block, 16, key, 32));
#if (OCTET_ORDER == BIG_ENDIAN)
	t[0] = u32Rev(t[0]);
	t[1] = u32Rev(t[1]);
	t[2] = u32Rev(t[2]);
	t[3] = u32Rev(t[3]);
#endif
	D((t + 0), (t + 1), (t + 2), (t + 3), key);
#if (OCTET_ORDER == BIG_ENDIAN)
	t[3] = u32Rev(t[3]);
	t[2] = u32Rev(t[2]);
	t[1] = u32Rev(t[1]);
	t[0] = u32Rev(t[0]);
#endif
}